

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall
QGraphicsDropShadowEffect::setOffset(QGraphicsDropShadowEffect *this,QPointF *offset)

{
  long lVar1;
  bool bVar2;
  QGraphicsDropShadowEffectPrivate *lhs;
  QPixmapDropShadowFilter *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsDropShadowEffectPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QGraphicsDropShadowEffect *)0x4a4bae);
  QPixmapDropShadowFilter::offset(in_RSI);
  bVar2 = ::operator==((QPointF *)lhs,in_RDI);
  if (!bVar2) {
    QPixmapDropShadowFilter::setOffset((QPixmapDropShadowFilter *)lhs,in_RDI);
    QGraphicsEffect::updateBoundingRect((QGraphicsEffect *)lhs);
    offsetChanged((QGraphicsDropShadowEffect *)lhs,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->offset() == offset)
        return;

    d->filter->setOffset(offset);
    updateBoundingRect();
    emit offsetChanged(offset);
}